

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::see(Forth *this)

{
  bool bVar1;
  uint index;
  Cell CVar2;
  _Setbase _Var3;
  Definition *this_00;
  ostream *poVar4;
  Definition *defn;
  Xt xt;
  allocator<char> local_39;
  string local_38;
  uint local_14;
  Forth *pFStack_10;
  uint found;
  Forth *this_local;
  
  pFStack_10 = this;
  bl(this);
  word(this);
  find(this);
  local_14 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SEE: undefined word",&local_39);
    throwMessage(this,&local_38,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    index = ForthStack<unsigned_int>::getTop(&this->dStack);
    ForthStack<unsigned_int>::pop(&this->dStack);
    this_00 = getDefinition(this,index);
    if ((code *)this_00->code == doColon &&
        ((code *)this_00->code == (code *)0x0 || *(long *)&this_00->field_0x8 == 0)) {
      CVar2 = getNumericBase(this);
      _Var3 = std::setbase(CVar2);
      poVar4 = std::operator<<((ostream *)&this->field_0x20,_Var3);
      std::ostream::operator<<(poVar4,this_00->does);
      poVar4 = std::operator<<((ostream *)&this->field_0x20," : ");
      std::operator<<(poVar4,(string *)&this_00->name);
      seeDoes(this,this_00->does);
    }
    else if (((code *)this_00->code == doCreate &&
              ((code *)this_00->code == (code *)0x0 || *(long *)&this_00->field_0x8 == 0)) ||
            ((code *)this_00->code == doDoes &&
             ((code *)this_00->code == (code *)0x0 || *(long *)&this_00->field_0x8 == 0))) {
      poVar4 = std::operator<<((ostream *)&this->field_0x20,"CREATE ");
      poVar4 = std::operator<<(poVar4,(string *)&this_00->name);
      poVar4 = std::operator<<(poVar4," ( ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this_00->parameter);
      std::operator<<(poVar4," )");
      if ((code *)this_00->code == doDoes &&
          ((code *)this_00->code == (code *)0x0 || *(long *)&this_00->field_0x8 == 0)) {
        std::operator<<((ostream *)&this->field_0x20," DOES>");
        seeDoes(this,this_00->does);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&this->field_0x20,": ");
      poVar4 = std::operator<<(poVar4,(string *)&this_00->name);
      poVar4 = std::operator<<(poVar4," <primitive ");
      CVar2 = getNumericBase(this);
      _Var3 = std::setbase(CVar2);
      poVar4 = std::operator<<(poVar4,_Var3);
      poVar4 = std::operator<<(poVar4,"addr of proc is not defined ");
      std::operator<<(poVar4,"> ;");
    }
    bVar1 = Definition::isImmediate(this_00);
    if (bVar1) {
      std::operator<<((ostream *)&this->field_0x20," immediate");
    }
  }
  return;
}

Assistant:

void see() {
			bl(); word(); find();

			auto found = dStack.getTop(); pop();
			if (!found) {
				throwMessage("SEE: undefined word",errorParsedStringOverflow);
				return;
			}
			auto xt=XT(dStack.getTop()); dStack.pop();
			auto defn = getDefinition(xt); 
			if ((defn)->code == &Forth::doColon) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout <<  SETBASE() << static_cast<SCell>(defn->does);
				std_cout << " : " << (defn)->name;
#endif
				seeDoes((defn)->does);
			}
			else if ((defn)->code == &Forth::doCreate || defn->code == &Forth::doDoes) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << "CREATE " << defn->name << " ( " << CELL(defn->parameter) << " )";
				if (defn->code == &Forth::doDoes) {
					std_cout << " DOES>";
					seeDoes(defn->does);
				}
#endif
			}
			else {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << ": " << defn->name << " <primitive " << SETBASE() << "addr of proc is not defined " << "> ;";
#endif
			}
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			if (defn->isImmediate()) std_cout << " immediate";
#endif
		}